

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcUtil.c
# Opt level: O2

int Lpk_FunSuppMinimize(Lpk_Fun_t *p)

{
  uint nVarsAll;
  long lVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  
  nVarsAll = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  uVar2 = p->uSupp;
  if ((-1 << (sbyte)nVarsAll ^ uVar2) == 0xffffffff) {
    iVar5 = 0;
  }
  else {
    *(uint *)&p->field_0x8 = *(uint *)&p->field_0x8 & 0xbfffffff;
    uVar4 = (uVar2 >> 1 & 0x55555555) + (uVar2 & 0x55555555);
    uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
    uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
    uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
    uVar4 = (uVar4 >> 0x10) + (uVar4 & 0xffff);
    iVar5 = 1;
    uVar3 = (ulong)(uint)(1 << ((sbyte)nVarsAll - 5U & 0x1f));
    if (nVarsAll < 6) {
      uVar3 = 1;
    }
    Kit_TruthShrink((uint *)(p->pFanins + uVar3 * 4 + 0x10),(uint *)&p->field_0xe4,uVar4,nVarsAll,
                    uVar2,1);
    uVar2 = 0;
    for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
      if ((p->uSupp >> ((uint)lVar1 & 0x1f) & 1) != 0) {
        p->pFanins[(int)uVar2] = p->pFanins[lVar1];
        p->pDelays[(int)uVar2] = p->pDelays[lVar1];
        uVar2 = uVar2 + 1;
      }
    }
    if (uVar2 != uVar4) {
      __assert_fail("k == nVarsNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcUtil.c"
                    ,0xa9,"int Lpk_FunSuppMinimize(Lpk_Fun_t *)");
    }
    *(uint *)&p->field_0x8 = *(uint *)&p->field_0x8 & 0xfffff07f | (uVar4 & 0x1f) << 7;
    p->uSupp = ~(-1 << ((byte)uVar4 & 0x1f));
  }
  return iVar5;
}

Assistant:

int Lpk_FunSuppMinimize( Lpk_Fun_t * p )
{
    int i, k, nVarsNew;
    // compress the truth table
    if ( p->uSupp == Kit_BitMask(p->nVars) )
        return 0;
    // invalidate support info
    p->fSupports = 0;
//Extra_PrintBinary( stdout, &p->uSupp, p->nVars ); printf( "\n" );
    // minimize support
    nVarsNew = Kit_WordCountOnes(p->uSupp);
    Kit_TruthShrink( Lpk_FunTruth(p, 1), Lpk_FunTruth(p, 0), nVarsNew, p->nVars, p->uSupp, 1 );
    k = 0;
    Lpk_SuppForEachVar( p->uSupp, i )
    {
        p->pFanins[k] = p->pFanins[i];
        p->pDelays[k] = p->pDelays[i];
/*
        if ( p->fSupports )
        {
            p->puSupps[2*k+0] = p->puSupps[2*i+0];
            p->puSupps[2*k+1] = p->puSupps[2*i+1];
        }
*/
        k++;
    }
    assert( k == nVarsNew );
    p->nVars = k;
    p->uSupp = Kit_BitMask(p->nVars);
    return 1;
}